

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_core_module.c
# Opt level: O1

char * ngx_stream_core_resolver(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  ngx_resolver_t *pnVar1;
  ngx_stream_core_srv_conf_t *cscf;
  
  if (*(long *)((long)conf + 0x48) != 0) {
    return "is duplicate";
  }
  pnVar1 = ngx_resolver_create(cf,(ngx_str_t *)((long)cf->args->elts + 0x10),cf->args->nelts - 1);
  *(ngx_resolver_t **)((long)conf + 0x48) = pnVar1;
  return (char *)-(ulong)(pnVar1 == (ngx_resolver_t *)0x0);
}

Assistant:

static char *
ngx_stream_core_resolver(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_stream_core_srv_conf_t  *cscf = conf;

    ngx_str_t  *value;

    if (cscf->resolver) {
        return "is duplicate";
    }

    value = cf->args->elts;

    cscf->resolver = ngx_resolver_create(cf, &value[1], cf->args->nelts - 1);
    if (cscf->resolver == NULL) {
        return NGX_CONF_ERROR;
    }

    return NGX_CONF_OK;
}